

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

bool picojson::_parse_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
               (value *out,
               input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *in)

{
  _Base_ptr *pp_Var1;
  string *this;
  anon_union_8_5_73595ed3_for_value_1 aVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  value local_30;
  
  local_30.type_ = 4;
  local_30.field_1.string_ = (string *)operator_new(0x18);
  *(undefined8 *)
   &(local_30.field_1.array_)->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>
       = 0;
  *(undefined8 *)&((_Rb_tree_header *)&(local_30.field_1.string_)->_M_string_length)->_M_header = 0;
  (((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
     *)&(local_30.field_1.array_)->
        super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)->
  super__Rb_tree_header)._M_header._M_parent = (_Base_ptr)0x0;
  value::operator=(out,&local_30);
  aVar2 = local_30.field_1;
  if (local_30.type_ == 5) {
    if (local_30.field_1.string_ == (string *)0x0) goto LAB_00107ee1;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                 *)local_30.field_1.string_);
    uVar5 = 0x30;
  }
  else if (local_30.type_ == 4) {
    if (local_30.field_1.string_ == (string *)0x0) goto LAB_00107ee1;
    std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
              ((vector<picojson::value,_std::allocator<picojson::value>_> *)local_30.field_1.string_
              );
    uVar5 = 0x18;
  }
  else {
    if ((local_30.type_ != 3) || (local_30.field_1.string_ == (string *)0x0)) goto LAB_00107ee1;
    pp_Var1 = &(((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  *)&(local_30.field_1.array_)->
                     super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)->
               super__Rb_tree_header)._M_header._M_parent;
    if ((_Base_ptr *)
        *(undefined1 **)
         &(local_30.field_1.array_)->
          super__Vector_base<picojson::value,_std::allocator<picojson::value>_> != pp_Var1) {
      operator_delete(*(undefined1 **)
                       &(local_30.field_1.array_)->
                        super__Vector_base<picojson::value,_std::allocator<picojson::value>_>,
                      (ulong)((long)&(*pp_Var1)->_M_color + 1));
    }
    uVar5 = 0x20;
  }
  operator_delete(aVar2.string_,uVar5);
LAB_00107ee1:
  this = (out->field_1).string_;
  iVar4 = input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::expect(in,0x5d);
  bVar3 = true;
  if (iVar4 == 0) {
    do {
      local_30.type_ = 0;
      std::vector<picojson::value,_std::allocator<picojson::value>_>::emplace_back<picojson::value>
                ((vector<picojson::value,_std::allocator<picojson::value>_> *)this,&local_30);
      aVar2 = local_30.field_1;
      if (local_30.type_ == 5) {
        if (local_30.field_1.string_ != (string *)0x0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                       *)local_30.field_1.string_);
          uVar5 = 0x30;
          goto LAB_00107f83;
        }
      }
      else if (local_30.type_ == 4) {
        if (local_30.field_1.string_ != (string *)0x0) {
          std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                    ((vector<picojson::value,_std::allocator<picojson::value>_> *)
                     local_30.field_1.string_);
          uVar5 = 0x18;
          goto LAB_00107f83;
        }
      }
      else if ((local_30.type_ == 3) && (local_30.field_1.string_ != (string *)0x0)) {
        pp_Var1 = &(((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      *)&(local_30.field_1.array_)->
                         super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)->
                   super__Rb_tree_header)._M_header._M_parent;
        if ((_Base_ptr *)
            *(undefined1 **)
             &(local_30.field_1.array_)->
              super__Vector_base<picojson::value,_std::allocator<picojson::value>_> != pp_Var1) {
          operator_delete(*(undefined1 **)
                           &(local_30.field_1.array_)->
                            super__Vector_base<picojson::value,_std::allocator<picojson::value>_>,
                          (ulong)((long)&(*pp_Var1)->_M_color + 1));
        }
        uVar5 = 0x20;
LAB_00107f83:
        operator_delete(aVar2.string_,uVar5);
      }
      bVar3 = _parse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        ((pointer)this->_M_string_length + -1,in);
      if (!bVar3) {
        return false;
      }
      iVar4 = input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::expect(in,0x2c);
    } while (iVar4 != 0);
    iVar4 = input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::expect(in,0x5d);
    bVar3 = iVar4 != 0;
  }
  return bVar3;
}

Assistant:

inline bool _parse_array(value& out, input<Iter>& in) {
    out = value(array_type, false);
    array& a = out.get<array>();
    if (in.expect(']')) {
      return true;
    }
    do {
      a.push_back(value());
      if (! _parse(a.back(), in)) {
	return false;
      }
    } while (in.expect(','));
    return in.expect(']');
  }